

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSop.c
# Opt level: O0

char * Abc_SopCreateNand(Mem_Flex_t *pMan,int nVars)

{
  char *pcVar1;
  int local_24;
  int i;
  char *pSop;
  int nVars_local;
  Mem_Flex_t *pMan_local;
  
  pcVar1 = Abc_SopStart(pMan,1,nVars);
  for (local_24 = 0; local_24 < nVars; local_24 = local_24 + 1) {
    pcVar1[local_24] = '1';
  }
  pcVar1[nVars + 1] = '0';
  return pcVar1;
}

Assistant:

char * Abc_SopCreateNand( Mem_Flex_t * pMan, int nVars )
{
    char * pSop;
    int i;
    pSop = Abc_SopStart( pMan, 1, nVars );
    for ( i = 0; i < nVars; i++ )
        pSop[i] = '1';
    pSop[nVars + 1] = '0';
    return pSop;
}